

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool wabt::anon_unknown_1::IsInstr(TokenTypePair pair)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = pair._M_elems[0] - AtomicLoad;
  if ((0x33 < uVar2) || (bVar1 = 1, (0xffffffff3dfffU >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
    if ((pair._M_elems[0] == Lpar) && (uVar2 = pair._M_elems[1] - AtomicLoad, uVar2 < 0x34)) {
      bVar1 = (byte)(0xffffffff3dfff >> ((byte)uVar2 & 0x3f));
    }
    else {
      bVar1 = 0;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool IsInstr(TokenTypePair pair) {
  return IsPlainOrBlockInstr(pair[0]) || IsExpr(pair);
}